

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupDfsSkip(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  long lVar10;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  pVVar8 = p->vCis;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      iVar1 = pVVar8->pArray[lVar10];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001e3580;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) {
LAB_001e359f:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_001e359f;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
      lVar10 = lVar10 + 1;
      pVVar8 = p->vCis;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      iVar1 = pVVar8->pArray[lVar10];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001e3580:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar1;
      if ((pGVar3->field_0x7 & 0x40) == 0) {
        Gia_ManDupDfs_rec(p_00,p,pGVar3);
        pVVar8 = p->vCos;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar8->nSize);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupDfsSkip( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
        if ( pObj->fMark1 == 0 )
            Gia_ManDupDfs_rec( pNew, p, pObj );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}